

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_scan_line(Parser *this)

{
  substr *psVar1;
  State *pSVar2;
  ulong offset;
  ulong uVar3;
  csubstr buf;
  size_t sVar4;
  char *pcVar5;
  
  pSVar2 = this->m_state;
  offset = (pSVar2->pos).super_LineCol.offset;
  psVar1 = &this->m_buf;
  uVar3 = (this->m_buf).len;
  buf.str = psVar1->str;
  buf.len = psVar1->len;
  if (offset < uVar3) {
    LineContents::reset_with_next_line(&pSVar2->line_contents,buf,offset);
    return;
  }
  pcVar5 = psVar1->str + uVar3;
  (pSVar2->line_contents).full.str = pcVar5;
  (pSVar2->line_contents).full.len = 0;
  (pSVar2->line_contents).stripped.str = pcVar5;
  (pSVar2->line_contents).stripped.len = 0;
  (pSVar2->line_contents).rem.str = pcVar5;
  (pSVar2->line_contents).rem.len = 0;
  sVar4 = basic_substring<const_char>::first_not_of(&(pSVar2->line_contents).full,' ',0);
  (pSVar2->line_contents).indentation = sVar4;
  return;
}

Assistant:

void Parser::_scan_line()
{
    if(m_state->pos.offset >= m_buf.len)
    {
        m_state->line_contents.reset(m_buf.last(0), m_buf.last(0));
        return;
    }
    m_state->line_contents.reset_with_next_line(m_buf, m_state->pos.offset);
}